

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall GameBoard::play(GameBoard *this,Value *input)

{
  int *piVar1;
  ArrayIndex AVar2;
  Int IVar3;
  Int IVar4;
  Int IVar5;
  Int IVar6;
  Value *pVVar7;
  Value *pVVar8;
  int index;
  int nextTypeForColor [2];
  Tetris enemyBlock;
  Tetris myBlock;
  Int local_a0 [2];
  int (*local_98) [7];
  Value *local_90;
  undefined8 local_88;
  Tetris local_80;
  Tetris local_58;
  
  pVVar7 = Json::Value::operator[](input,"responses");
  AVar2 = Json::Value::size(pVVar7);
  this->turnID = AVar2 + 1;
  local_90 = input;
  pVVar7 = Json::Value::operator[](input,"requests");
  pVVar7 = Json::Value::operator[](pVVar7,0);
  pVVar8 = Json::Value::operator[](pVVar7,"block");
  IVar3 = Json::Value::asInt(pVVar8);
  pVVar7 = Json::Value::operator[](pVVar7,"color");
  IVar4 = Json::Value::asInt(pVVar7);
  this->currBotColor = IVar4;
  this->enemyColor = 1 - IVar4;
  local_a0[0] = IVar3;
  local_a0[1] = IVar3;
  piVar1 = this->typeCountForColor[0] + IVar3;
  *piVar1 = *piVar1 + 1;
  piVar1 = this->typeCountForColor[1] + IVar3;
  *piVar1 = *piVar1 + 1;
  index = 1;
  if (1 < this->turnID) {
    local_98 = this->typeCountForColor;
    do {
      local_88 = CONCAT44(local_a0[1],local_a0[0]);
      pVVar7 = Json::Value::operator[](local_90,"responses");
      pVVar7 = Json::Value::operator[](pVVar7,index + -1);
      pVVar8 = Json::Value::operator[](pVVar7,"block");
      IVar5 = Json::Value::asInt(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"x");
      IVar3 = Json::Value::asInt(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"y");
      IVar4 = Json::Value::asInt(pVVar8);
      pVVar7 = Json::Value::operator[](pVVar7,"o");
      IVar6 = Json::Value::asInt(pVVar7);
      local_58.color = this->currBotColor;
      local_58.blockType = *(int *)((long)&local_88 + (long)local_58.color * 4);
      local_58.shape = blockShape[local_58.blockType];
      if (IVar4 == -1) {
        IVar4 = local_58.blockX;
      }
      if (IVar3 == -1) {
        IVar3 = local_58.blockY;
      }
      if (IVar6 == -1) {
        IVar6 = local_58.orientation;
      }
      local_58.gameBoard = this;
      local_58.blockX = IVar4;
      local_58.blockY = IVar3;
      local_58.orientation = IVar6;
      Tetris::place(&local_58);
      local_98[this->enemyColor][IVar5] = local_98[this->enemyColor][IVar5] + 1;
      local_a0[this->enemyColor] = IVar5;
      pVVar7 = Json::Value::operator[](local_90,"requests");
      pVVar7 = Json::Value::operator[](pVVar7,index);
      pVVar8 = Json::Value::operator[](pVVar7,"block");
      IVar5 = Json::Value::asInt(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"x");
      IVar3 = Json::Value::asInt(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"y");
      IVar4 = Json::Value::asInt(pVVar8);
      pVVar7 = Json::Value::operator[](pVVar7,"o");
      IVar6 = Json::Value::asInt(pVVar7);
      local_80.color = this->enemyColor;
      local_80.blockType = *(int *)((long)&local_88 + (long)local_80.color * 4);
      local_80.shape = blockShape[local_80.blockType];
      if (IVar4 == -1) {
        IVar4 = local_80.blockX;
      }
      if (IVar3 == -1) {
        IVar3 = local_80.blockY;
      }
      if (IVar6 == -1) {
        IVar6 = local_80.orientation;
      }
      local_80.gameBoard = this;
      local_80.blockX = IVar4;
      local_80.blockY = IVar3;
      local_80.orientation = IVar6;
      Tetris::place(&local_80);
      local_98[this->currBotColor][IVar5] = local_98[this->currBotColor][IVar5] + 1;
      local_a0[this->currBotColor] = IVar5;
      eliminate(this,0);
      eliminate(this,1);
      transfer(this);
      index = index + 1;
    } while (index < this->turnID);
  }
  this->currBlockType = local_a0[this->currBotColor];
  this->enemyType = local_a0[this->enemyColor];
  return;
}

Assistant:

void GameBoard::play(const Json::Value &input)
{
    int nextTypeForColor[2];
    int blockType;

    // 先读入第一回合，得到自己的颜色
    // 双方的第一块肯定是一样的
    turnID = input["responses"].size() + 1;
    auto &first = input["requests"][(Json::UInt) 0];

    blockType = first["block"].asInt();
    currBotColor = first["color"].asInt();

    enemyColor = 1 - currBotColor;
    nextTypeForColor[0] = blockType;
    nextTypeForColor[1] = blockType;
    typeCountForColor[0][blockType]++;
    typeCountForColor[1][blockType]++;


    // 然后分析以前每回合的输入输出，并恢复状态
    // 循环中，color 表示当前这一行是 color 的行为
    // 平台保证所有输入都是合法输入
    for (int i = 1; i < turnID; i++) {
        int currTypeForColor[2] = { nextTypeForColor[0], nextTypeForColor[1] };
        int x, y, o;
        // 根据这些输入输出逐渐恢复状态到当前回合

        // 先读自己的输出，也就是自己的行为
        // 自己的输出是一个序列，但是只有最后一步有用
        // 所以只保留最后一步
        // 然后模拟最后一步放置块
        auto &myOutput = input["responses"][i - 1];
        blockType = myOutput["block"].asInt();
        y = myOutput["x"].asInt();
        x = myOutput["y"].asInt();
        o = myOutput["o"].asInt();

        // 我当时把上一块落到了 x y o！
        Tetris myBlock(this, currTypeForColor[currBotColor], currBotColor);
        myBlock.set(x, y, o).place();

        // 我给对方什么块来着？
        typeCountForColor[enemyColor][blockType]++;
        nextTypeForColor[enemyColor] = blockType;

        // 然后读自己的输入，也就是对方的行为
        // 裁判给自己的输入是对方的最后一步
        auto &myInput = input["requests"][i];
        blockType = myInput["block"].asInt();
        y = myInput["x"].asInt();
        x = myInput["y"].asInt();
        o = myInput["o"].asInt();

        // 对方当时把上一块落到了 x y o！
        Tetris enemyBlock(this, currTypeForColor[enemyColor], enemyColor);
        enemyBlock.set(x, y, o).place();

        // 对方给我什么块来着？
        typeCountForColor[currBotColor][blockType]++;
        nextTypeForColor[currBotColor] = blockType;

        // 检查消去
        eliminate(0);
        eliminate(1);

        // 进行转移
        transfer();
    }
    currBlockType = nextTypeForColor[currBotColor];
    enemyType = nextTypeForColor[enemyColor];
}